

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O0

void savegamestate(memfile *mf)

{
  uint local_18;
  uint book_id;
  memfile *mf_local;
  
  mtag(mf,0,MTAG_GAMESTATE);
  mfmagic_set(mf,0x54415453);
  save_timeout(mf);
  save_timers(mf,level,1);
  save_light_sources(mf,level,1);
  saveobjchn(mf,invent);
  saveobjchn(mf,magic_chest_objs);
  savemonchn(mf,migrating_mons);
  save_mvitals(mf);
  save_quest_status(mf);
  save_spellbook(mf);
  save_artifacts(mf);
  save_oracles(mf);
  save_tutorial(mf);
  mwrite(mf,pl_character,0x20);
  mwrite(mf,pl_fruit,0x20);
  mwrite32(mf,current_fruit);
  savefruitchn(mf);
  savenames(mf);
  save_waterlevel(mf);
  mwrite32(mf,lastinvnr);
  save_mt_state(mf);
  save_track(mf);
  save_food(mf);
  save_steal(mf);
  save_dig_status(mf);
  save_occupations(mf);
  if (book == (obj *)0x0) {
    local_18 = 0;
  }
  else {
    local_18 = book->o_id;
  }
  mwrite32(mf,local_18);
  mwrite32(mf,stetho_last_used_move);
  mwrite32(mf,stetho_last_used_movement);
  mwrite32(mf,multi);
  save_rndmonst_state(mf);
  save_history(mf);
  return;
}

Assistant:

static void savegamestate(struct memfile *mf)
{
	unsigned book_id;

	mtag(mf, 0, MTAG_GAMESTATE);
	mfmagic_set(mf, STATE_MAGIC);

	/* must come before magic_chest_objs and migrating_mons are freed */
	save_timeout(mf);
	save_timers(mf, level, RANGE_GLOBAL);
	save_light_sources(mf, level, RANGE_GLOBAL);

	saveobjchn(mf, invent);
	saveobjchn(mf, magic_chest_objs);
	savemonchn(mf, migrating_mons);
	save_mvitals(mf);

	save_quest_status(mf);
	save_spellbook(mf);
	save_artifacts(mf);
	save_oracles(mf);

	save_tutorial(mf);

	mwrite(mf, pl_character, sizeof pl_character);
	mwrite(mf, pl_fruit, sizeof pl_fruit);
	mwrite32(mf, current_fruit);
	savefruitchn(mf);
	savenames(mf);
	save_waterlevel(mf);
	mwrite32(mf, lastinvnr);
	save_mt_state(mf);
	save_track(mf);
	save_food(mf);
	save_steal(mf);
	save_dig_status(mf);
	save_occupations(mf);
	book_id = book ? book->o_id : 0;
	mwrite32(mf, book_id);
	mwrite32(mf, stetho_last_used_move);
	mwrite32(mf, stetho_last_used_movement);
	mwrite32(mf, multi);
	save_rndmonst_state(mf);
	save_history(mf);
}